

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O0

void __thiscall
kj::anon_unknown_8::MmapDisposer::disposeImpl
          (MmapDisposer *this,void *firstElement,size_t elementSize,size_t elementCount,
          size_t capacity,_func_void_void_ptr *destroyElement)

{
  int osErrorNumber;
  void *pvVar1;
  Fault local_60;
  Fault f;
  SyscallResult local_4c;
  undefined1 auStack_48 [4];
  SyscallResult _kjSyscallResult;
  MmapRange range;
  _func_void_void_ptr *destroyElement_local;
  size_t capacity_local;
  size_t elementCount_local;
  size_t elementSize_local;
  void *firstElement_local;
  MmapDisposer *this_local;
  
  _auStack_48 = getMmapRange((uint64_t)firstElement,elementSize * elementCount);
  f.exception = (Exception *)auStack_48;
  local_4c = _::Debug::
             syscall<kj::(anonymous_namespace)::MmapDisposer::disposeImpl(void*,unsigned_long,unsigned_long,unsigned_long,void(*)(void*))const::_lambda()_1_>
                       ((anon_class_8_1_a88e285d *)&f,false);
  pvVar1 = _::Debug::SyscallResult::operator_cast_to_void_(&local_4c);
  if (pvVar1 == (void *)0x0) {
    osErrorNumber = _::Debug::SyscallResult::getErrorNumber(&local_4c);
    _::Debug::Fault::Fault
              (&local_60,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
               ,0xfe,osErrorNumber,"munmap(reinterpret_cast<byte*>(range.offset), range.size)","");
    _::Debug::Fault::~Fault(&local_60);
  }
  return;
}

Assistant:

void disposeImpl(void* firstElement, size_t elementSize, size_t elementCount,
                   size_t capacity, void (*destroyElement)(void*)) const {
    auto range = getMmapRange(reinterpret_cast<uintptr_t>(firstElement),
                              elementSize * elementCount);
    KJ_SYSCALL(munmap(reinterpret_cast<byte*>(range.offset), range.size)) { break; }
  }